

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O2

double __thiscall spatial_region::get_max_w(spatial_region *this,double left,double right)

{
  double dVar1;
  celle *pcVar2;
  cellb *pcVar3;
  long lVar4;
  int j;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar7 = ZEXT1664(ZEXT816(0));
  for (lVar4 = (long)(int)left; (double)(int)lVar4 < right; lVar4 = lVar4 + 1) {
    for (uVar5 = 0; uVar5 != (uint)(~(this->ny >> 0x1f) & this->ny); uVar5 = uVar5 + 1) {
      lVar6 = 0;
      while ((ulong)(uint)(~(this->nz >> 0x1f) & this->nz) * 0x18 - lVar6 != 0) {
        pcVar2 = (this->ce).p._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>
                 ._M_t.super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                 super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar4][uVar5];
        pcVar3 = (this->cb).p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>
                 ._M_t.super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                 super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar4][uVar5];
        dVar1 = *(double *)((long)&pcVar2->ey + lVar6);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)((long)&pcVar2->ex + lVar6);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)&pcVar2->ez + lVar6);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)((long)&pcVar3->bx + lVar6);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)((long)&pcVar3->by + lVar6);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar1 * dVar1;
        auVar8 = vfmadd231sd_fma(auVar9,auVar8,auVar8);
        auVar8 = vfmadd213sd_fma(auVar13,auVar13,auVar8);
        auVar8 = vfmadd213sd_fma(auVar12,auVar12,auVar8);
        auVar8 = vfmadd231sd_fma(auVar8,auVar10,auVar10);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)&pcVar3->bz + lVar6);
        lVar6 = lVar6 + 0x18;
        auVar8 = vfmadd213sd_fma(auVar11,auVar11,auVar8);
        auVar8 = vmaxsd_avx(auVar8,auVar7._0_16_);
        auVar7 = ZEXT1664(auVar8);
      }
    }
  }
  return auVar7._0_8_;
}

Assistant:

double spatial_region::get_max_w(double left, double right) {
    double max_w = 0.0;
    for (int i = left; i < right; i++) {
        for (int j = 0; j < ny; j++) {
            for (int k = 0; k < nz; k++) {
                celle & e = ce[i][j][k];
                cellb & b = cb[i][j][k];
                // fields are not interpolated to the same point, but should be fine for estimation
                double w = e.ex * e.ex + e.ey * e.ey + e.ez * e.ez + b.bx * b.bx + b.by * b.by + b.bz * b.bz;
                if (w > max_w) {
                    max_w = w;
                }
            }
        }
    }
    return max_w;
}